

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O2

bool __thiscall BamTools::Internal::BamReaderPrivate::Seek(BamReaderPrivate *this,int64_t *position)

{
  bool bVar1;
  string message;
  string streamError;
  allocator local_81;
  allocator local_80 [32];
  string local_60;
  string local_40;
  
  bVar1 = BgzfStream::IsOpen(&this->m_stream);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_40,"BamReader::Seek",local_80);
    std::__cxx11::string::string((string *)&local_60,"cannot seek on unopened BAM file",&local_81);
    SetErrorString(this,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    BgzfStream::Seek(&this->m_stream,position);
  }
  return bVar1;
}

Assistant:

bool BamReaderPrivate::Seek(const int64_t& position)
{

    // skip if BAM file not open
    if (!IsOpen()) {
        SetErrorString("BamReader::Seek", "cannot seek on unopened BAM file");
        return false;
    }

    try {
        m_stream.Seek(position);
        return true;
    } catch (const BamException& e) {
        const std::string streamError = e.what();
        const std::string message = std::string("could not seek in BAM file: \n\t") + streamError;
        SetErrorString("BamReader::Seek", message);
        return false;
    }
}